

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool CoreML::Specification::FlattenLayerParams_FlattenOrder_IsValid(int value)

{
  return (uint)value < 2;
}

Assistant:

bool FlattenLayerParams_FlattenOrder_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}